

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_neon_add(TCGContext_conflict1 *tcg_ctx,int size,TCGv_i32 t0,TCGv_i32 t1)

{
  uintptr_t o;
  code *func;
  TCGTemp *local_18;
  TCGv_i32 local_10;
  
  if (size == 2) {
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_add_i32,(TCGArg)(t0 + (long)tcg_ctx),
                        (TCGArg)(t0 + (long)tcg_ctx),(TCGArg)(t1 + (long)tcg_ctx));
    return;
  }
  if (size == 1) {
    func = helper_neon_add_u16_aarch64;
  }
  else {
    if (size != 0) {
      abort();
    }
    func = helper_neon_add_u8_aarch64;
  }
  local_10 = t1 + (long)tcg_ctx;
  local_18 = (TCGTemp *)(t0 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,func,local_18,2,&local_18);
  return;
}

Assistant:

static inline void gen_neon_add(TCGContext *tcg_ctx, int size, TCGv_i32 t0, TCGv_i32 t1)
{
    switch (size) {
    case 0: gen_helper_neon_add_u8(tcg_ctx, t0, t0, t1); break;
    case 1: gen_helper_neon_add_u16(tcg_ctx, t0, t0, t1); break;
    case 2: tcg_gen_add_i32(tcg_ctx, t0, t0, t1); break;
    default: abort();
    }
}